

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgetwindow_p.cpp
# Opt level: O0

void QWidgetWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QWidgetWindow *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    updateObjectName((QWidgetWindow *)0x0);
  }
  return;
}

Assistant:

void QWidgetWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updateObjectName(); break;
        default: ;
        }
    }
    (void)_a;
}